

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_impl.hpp
# Opt level: O3

string * __thiscall
toml::format_error_abi_cxx11_(string *__return_storage_ptr__,toml *this,error_info *err)

{
  ostringstream oss;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (color::ansi::detail::color_status()::status == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\x1b[31m",5);
  }
  if ((color::ansi::detail::color_status()::status & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\x1b[01m",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[error]",7);
  if (color::ansi::detail::color_status()::status == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\x1b[00m",5);
  }
  std::__cxx11::stringbuf::str();
  format_error(__return_storage_ptr__,&local_1b0,(error_info *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string format_error(const error_info& err)
{
    std::ostringstream oss;
    oss << color::red << color::bold << "[error]" << color::reset;
    return format_error(oss.str(), err);
}